

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetJacTimes(void *cvode_mem,CVLsJacTimesSetupFn jtsetup,CVLsJacTimesVecFn jtimes)

{
  long in_RDX;
  undefined8 in_RSI;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  CVodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (CVLsMem *)0x13c15e);
  if (local_4 == 0) {
    if (*(long *)(*(long *)(*(long *)(in_stack_ffffffffffffffd0 + 0x48) + 8) + 0x10) == 0) {
      cvProcessError(in_stack_ffffffffffffffd8,-3,0x247,"CVodeSetJacTimes",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"SUNLinearSolver object does not support user-supplied ATimes routine");
      local_4 = -3;
    }
    else {
      if (in_RDX == 0) {
        in_stack_ffffffffffffffd0[0xf8] = '\x01';
        in_stack_ffffffffffffffd0[0xf9] = '\0';
        in_stack_ffffffffffffffd0[0xfa] = '\0';
        in_stack_ffffffffffffffd0[0xfb] = '\0';
        in_stack_ffffffffffffffd0[0x100] = '\0';
        in_stack_ffffffffffffffd0[0x101] = '\0';
        in_stack_ffffffffffffffd0[0x102] = '\0';
        in_stack_ffffffffffffffd0[0x103] = '\0';
        in_stack_ffffffffffffffd0[0x104] = '\0';
        in_stack_ffffffffffffffd0[0x105] = '\0';
        in_stack_ffffffffffffffd0[0x106] = '\0';
        in_stack_ffffffffffffffd0[0x107] = '\0';
        *(code **)(in_stack_ffffffffffffffd0 + 0x108) = cvLsDQJtimes;
        *(CVRhsFn *)(in_stack_ffffffffffffffd0 + 0x110) = in_stack_ffffffffffffffd8->cv_f;
        *(CVodeMem *)(in_stack_ffffffffffffffd0 + 0x118) = in_stack_ffffffffffffffd8;
      }
      else {
        in_stack_ffffffffffffffd0[0xf8] = '\0';
        in_stack_ffffffffffffffd0[0xf9] = '\0';
        in_stack_ffffffffffffffd0[0xfa] = '\0';
        in_stack_ffffffffffffffd0[0xfb] = '\0';
        *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x100) = in_RSI;
        *(long *)(in_stack_ffffffffffffffd0 + 0x108) = in_RDX;
        *(void **)(in_stack_ffffffffffffffd0 + 0x118) = in_stack_ffffffffffffffd8->cv_user_data;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetJacTimes(void* cvode_mem, CVLsJacTimesSetupFn jtsetup,
                     CVLsJacTimesVecFn jtimes)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (cvls_mem->LS->ops->setatimes == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (CVLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in CVLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    cvls_mem->jtimesDQ = SUNFALSE;
    cvls_mem->jtsetup  = jtsetup;
    cvls_mem->jtimes   = jtimes;
    cvls_mem->jt_data  = cv_mem->cv_user_data;
  }
  else
  {
    cvls_mem->jtimesDQ = SUNTRUE;
    cvls_mem->jtsetup  = NULL;
    cvls_mem->jtimes   = cvLsDQJtimes;
    cvls_mem->jt_f     = cv_mem->cv_f;
    cvls_mem->jt_data  = cv_mem;
  }

  return (CVLS_SUCCESS);
}